

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

ifstream * ev3dev::anon_unknown_20::ifstream_open(string *path)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *__n;
  void *pvVar3;
  char cVar4;
  int iVar5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  undefined8 *unaff_R12;
  void *unaff_R13;
  void *unaff_R14;
  _List_node_base *p_Var8;
  
  if ((anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ == '\0')
  {
    _GLOBAL__N_1::ifstream_open();
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)
                             (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx)
  ;
  p_Var6 = DAT_0011dba0;
  if (iVar5 != 0) {
    uVar7 = std::__throw_system_error(iVar5);
    if ((void *)*unaff_R12 != unaff_R13) {
      operator_delete((void *)*unaff_R12);
    }
    operator_delete(unaff_R14);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
    _Unwind_Resume(uVar7);
  }
  p_Var8 = DAT_0011dba0;
  if (DAT_0011dba0 != (_List_node_base *)&DAT_0011dba0) {
    pcVar1 = (path->_M_dataplus)._M_p;
    p_Var2 = (_List_node_base *)path->_M_string_length;
    do {
      __n = p_Var8[1]._M_prev;
      if (__n == p_Var2) {
        if (__n == (_List_node_base *)0x0) break;
        iVar5 = bcmp(p_Var8[1]._M_next,pcVar1,(size_t)__n);
        if (iVar5 == 0) break;
      }
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&DAT_0011dba0);
  }
  if (p_Var8 == (_List_node_base *)&DAT_0011dba0) {
    while (pvVar3 = DAT_0011dba8,
          (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
          DAT_0011dbb0 + 1U) {
      DAT_0011dbb0 = DAT_0011dbb0 + -1;
      std::__detail::_List_node_base::_M_unhook();
      std::ifstream::~ifstream((void *)((long)pvVar3 + 0x30));
      if (*(void **)((long)pvVar3 + 0x10) != (void *)((long)pvVar3 + 0x20)) {
        operator_delete(*(void **)((long)pvVar3 + 0x10));
      }
      operator_delete(pvVar3);
    }
    p_Var6 = (_List_node_base *)operator_new(0x238);
    p_Var6[1]._M_next = p_Var6 + 2;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var6 + 1),pcVar1,pcVar1 + path->_M_string_length);
    std::ifstream::ifstream(p_Var6 + 3);
    std::__detail::_List_node_base::_M_hook(p_Var6);
    DAT_0011dbb0 = DAT_0011dbb0 + 1;
  }
  else if (p_Var8->_M_next != p_Var6 && p_Var6 != p_Var8) {
    std::__detail::_List_node_base::_M_transfer(p_Var6,p_Var8);
  }
  p_Var6 = DAT_0011dba0 + 3;
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::ifstream::open((string *)p_Var6,(_Ios_Openmode)path);
  }
  else {
    std::ios::clear((int)p_Var6->_M_next[-2]._M_prev + (int)p_Var6);
    std::istream::seekg((long)p_Var6,_S_beg);
  }
  return (ifstream *)p_Var6;
}

Assistant:

std::ifstream &ifstream_open(const std::string &path) {
    std::ifstream &file = ifstream_cache(path);
    if (!file.is_open()) {
        file.open(path);
    } else {
        // Clear the flags bits in case something happened (like reaching EOF).
        file.clear();
        file.seekg(0, std::ios::beg);
    }
    return file;
}